

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WritePrefixBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  Newline local_51;
  Type local_50;
  StackVar local_4c;
  Type local_44;
  StackVar local_40;
  Enum local_38;
  StackVar local_34;
  Type local_2c;
  char *pcStack_28;
  Type result_type;
  char *op_local;
  CWriter *this_local;
  Opcode opcode_local;
  
  pcStack_28 = op;
  this_local._4_4_ = opcode.enum_;
  local_38 = (Enum)Opcode::GetResultType((Opcode *)((long)&this_local + 4));
  local_2c = (Type)local_38;
  StackVar::StackVar(&local_34,1,(Type)local_38);
  Type::Type(&local_44,Any);
  StackVar::StackVar(&local_40,1,local_44);
  Type::Type(&local_50,Any);
  StackVar::StackVar(&local_4c,0,local_50);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_34,(char (*) [4])0x2d3bb0,&stack0xffffffffffffffd8,
             (char (*) [2])0x2d2c67,&local_40,(char (*) [3])0x2d3770,&local_4c,
             (char (*) [3])0x2d3da6,&local_51);
  DropTypes(this,2);
  PushType(this,local_2c);
  return;
}

Assistant:

void CWriter::WritePrefixBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type), " = ", op, "(", StackVar(1), ", ",
        StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}